

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter.c
# Opt level: O3

void xml_show_incomplete(TestReporter *reporter,char *filename,int line,char *message,
                        __va_list_tag *arguments)

{
  undefined8 uVar1;
  xmlChar *pxVar2;
  xmlNodePtr node;
  
  uVar1 = xmlNewChild(*(undefined8 *)(&DAT_00117f68 + (long)context_stack_p * 0x28),0,"error",0);
  xmlNewProp(uVar1,"type","Fatal");
  if (message == (char *)0x0) {
    xmlNewProp(uVar1,"message",
               "Test terminated unexpectedly, likely from a non-standard exception or Posix signal")
    ;
  }
  else {
    pxVar2 = xml_secure_vprint(message,arguments);
    xmlNewProp(uVar1,"message",pxVar2);
    (*_xmlFree)(pxVar2);
  }
  node = (xmlNodePtr)xmlNewChild(uVar1,0,"location",0);
  pxVar2 = xmlEscapePropValue(filename);
  xmlNewProp(node,"file",pxVar2);
  (*_xmlFree)(pxVar2);
  xmlFormatProp(node,(xmlChar *)"line","%d",(ulong)(uint)line);
  return;
}

Assistant:

static void xml_show_incomplete(TestReporter *reporter, const char *filename, int line, const char *message, va_list arguments) {
    char buffer[1000];

    output = concat(output, indent(reporter));
    output = concat(output, "<error type=\"Fatal\" message=\"");
    vsnprintf(buffer, sizeof(buffer)/sizeof(buffer[0]),
            message ? message: "Test terminated unexpectedly, likely from a non-standard exception or Posix signal", arguments);
    output = concat(output, buffer);
    output = concat(output, "\">\n");
    output = concat(output, indent(reporter));
    snprintf(buffer, sizeof(buffer)/sizeof(buffer[0]),"\t<location file=\"%s\" line=\"%d\"/>\n", filename, line);
    output = concat(output, buffer);
    output = concat(output, indent(reporter));
    output = concat(output, "</error>\n");

    fseek(child_output_tmpfile,0,SEEK_SET);
    fputs(output, child_output_tmpfile);
}